

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

longlong __thiscall chaiscript::Boxed_Number::get_as_checked<long_long>(Boxed_Number *this)

{
  Common_Types CVar1;
  undefined8 *puVar2;
  
  CVar1 = get_common_type(&this->bv);
  if (CVar1 == t_int64) {
    return *((this->bv).m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_const_data_ptr;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_003fbde8;
  __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

Target get_as_checked() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          check_type<int32_t, Target>();
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          check_type<uint8_t, Target>();
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          check_type<int8_t, Target>();
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          check_type<uint16_t, Target>();
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          check_type<int16_t, Target>();
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          check_type<uint32_t, Target>();
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          check_type<uint64_t, Target>();
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          check_type<int64_t, Target>();
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          check_type<double, Target>();
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          check_type<float, Target>();
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          check_type<long double, Target>();
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }